

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O0

void __thiscall fsbridge::FileLock::~FileLock(FileLock *this)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)&in_RDI[1]._M_dataplus._M_p != -1) {
    close(*(int *)&in_RDI[1]._M_dataplus._M_p);
  }
  std::__cxx11::string::~string(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

FileLock::~FileLock()
{
    if (fd != -1) {
        close(fd);
    }
}